

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O3

QTextCharFormat * __thiscall
QMap<QDate,_QTextCharFormat>::value
          (QTextCharFormat *__return_storage_ptr__,QMap<QDate,_QTextCharFormat> *this,QDate *key,
          QTextCharFormat *defaultValue)

{
  QMapData<std::map<QDate,_QTextCharFormat,_std::less<QDate>,_std::allocator<std::pair<const_QDate,_QTextCharFormat>_>_>_>
  *pQVar1;
  long lVar2;
  _Rb_tree_header *p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 != (QMapData<std::map<QDate,_QTextCharFormat,_std::less<QDate>,_std::allocator<std::pair<const_QDate,_QTextCharFormat>_>_>_>
                  *)0x0) &&
     (p_Var4 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8),
     p_Var4 != (_Base_ptr)0x0)) {
    p_Var3 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header;
    lVar2 = key->jd;
    p_Var5 = &p_Var3->_M_header;
    do {
      if (lVar2 <= *(long *)(p_Var4 + 1)) {
        p_Var5 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(long *)(p_Var4 + 1) < lVar2];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var3) && (*(long *)(p_Var5 + 1) <= lVar2)) {
      defaultValue = (QTextCharFormat *)&p_Var5[1]._M_parent;
    }
  }
  QTextFormat::QTextFormat
            (&__return_storage_ptr__->super_QTextFormat,&defaultValue->super_QTextFormat);
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }